

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O3

RayDifferential * __thiscall
pbrt::SurfaceInteraction::SpawnRay
          (RayDifferential *__return_storage_ptr__,SurfaceInteraction *this,RayDifferential *rayi,
          BSDF *bsdf,Vector3f wi,int flags,Float eta)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined8 uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar20;
  undefined4 uVar21;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined1 auVar32 [16];
  Point3fi *pPVar33;
  Point3fi *pPVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar51;
  undefined1 auVar52 [64];
  float fVar53;
  float fVar60;
  float fVar61;
  undefined1 auVar54 [16];
  float fVar62;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  float fVar64;
  undefined1 auVar65 [16];
  float fVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  Vector3f local_30;
  float local_24;
  
  local_30.super_Tuple3<pbrt::Vector3,_float>.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar52._8_56_ = wi._8_56_;
  auVar52._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  uVar15 = vmovlps_avx(auVar52._0_16_);
  local_30.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar15;
  local_30.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar15 >> 0x20);
  local_24 = eta;
  Interaction::SpawnRay(__return_storage_ptr__,&this->super_Interaction,&local_30);
  if (rayi->hasDifferentials == true) {
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    fVar66 = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    fVar1 = this->dvdy;
    uVar16._0_4_ = this->dudx;
    uVar16._4_4_ = this->dvdx;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar16;
    fVar2 = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar17._0_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar17._4_4_ = (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar17;
    fVar51 = this->dudy;
    uVar3 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar20 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar42._4_4_ = uVar20;
    auVar42._0_4_ = uVar3;
    auVar42._8_8_ = 0;
    uVar4 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.y;
    uVar21 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar50._4_4_ = uVar21;
    auVar50._0_4_ = uVar4;
    auVar50._8_8_ = 0;
    uVar18._0_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
    uVar18._4_4_ = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar18;
    fVar53 = (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar44 = ZEXT416((uint)fVar53);
    auVar36 = vxorps_avx512vl(ZEXT416((uint)(rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x
                                     ),auVar35);
    uVar19._0_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    uVar19._4_4_ = (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar19;
    fVar60 = fVar1 * fVar66 + fVar2 * fVar51;
    auVar37 = vpermi2ps_avx512vl(_DAT_0054e630,auVar41,ZEXT416((uint)fVar66));
    auVar40 = vshufps_avx(auVar38,auVar38,0xe1);
    auVar38 = vxorps_avx512vl(ZEXT416((uint)(rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z
                                     ),auVar35);
    fVar66 = (this->super_Interaction).wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar39 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar45,ZEXT416((uint)fVar2));
    auVar41 = vmovshdup_avx(auVar41);
    auVar45 = vmovshdup_avx(auVar50);
    auVar63._0_4_ = auVar37._0_4_ * auVar40._0_4_ + (float)(undefined4)uVar16 * auVar39._0_4_;
    auVar63._4_4_ = auVar37._4_4_ * auVar40._4_4_ + (float)uVar16._4_4_ * auVar39._4_4_;
    auVar63._8_4_ = auVar37._8_4_ * auVar40._8_4_ + auVar39._8_4_ * 0.0;
    auVar63._12_4_ = auVar37._12_4_ * auVar40._12_4_ + auVar39._12_4_ * 0.0;
    uVar5 = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar22 = (rayi->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar37._4_4_ = uVar22;
    auVar37._0_4_ = uVar5;
    auVar37._8_8_ = 0;
    auVar40 = vxorps_avx512vl(auVar37,auVar35);
    auVar37 = vsubps_avx(auVar40,auVar42);
    auVar40._0_4_ = (float)(undefined4)uVar16 * (float)(undefined4)uVar17;
    auVar40._4_4_ = (float)uVar16._4_4_ * (float)uVar17._4_4_;
    auVar40._8_8_ = 0;
    auVar46._0_4_ = (float)(undefined4)uVar17 * fVar1 + (float)(undefined4)uVar19 * fVar51;
    auVar46._4_4_ = (float)uVar17._4_4_ * fVar1 + (float)uVar19._4_4_ * fVar51;
    auVar46._8_4_ = fVar1 * 0.0 + fVar51 * 0.0;
    auVar46._12_4_ = fVar1 * 0.0 + fVar51 * 0.0;
    uVar6 = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar23 = (rayi->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z;
    auVar39._4_4_ = uVar23;
    auVar39._0_4_ = uVar6;
    auVar39._8_8_ = 0;
    fVar61 = auVar45._0_4_;
    fVar2 = auVar38._0_4_ - fVar61;
    fVar51 = auVar36._0_4_ - fVar66;
    auVar40 = vmovshdup_avx(auVar40);
    fVar1 = (float)(undefined4)uVar16 * auVar41._0_4_ + auVar40._0_4_;
    auVar41 = vxorps_avx512vl(auVar39,auVar35);
    auVar41 = vsubps_avx(auVar41,auVar50);
    auVar40 = ZEXT416((uint)fVar53);
    auVar35 = ZEXT416((uint)fVar1);
    auVar36 = ZEXT416((uint)fVar51);
    if (flags == 0x12) {
      __return_storage_ptr__->hasDifferentials = true;
      pPVar33 = &(this->super_Interaction).pi;
      pPVar34 = &(this->super_Interaction).pi;
      auVar43._0_4_ =
           (pPVar33->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar43._4_4_ =
           (pPVar33->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar43._8_4_ =
           (pPVar34->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar43._12_4_ =
           (pPVar34->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      uVar15 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar38 = vinsertps_avx(auVar43,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      fVar64 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar39 = vaddss_avx512f(ZEXT416((uint)fVar64),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      auVar65._0_4_ = (float)uVar15 + auVar38._0_4_;
      auVar65._4_4_ = (float)((ulong)uVar15 >> 0x20) + auVar38._4_4_;
      auVar65._8_4_ = auVar38._8_4_ + 0.0;
      auVar65._12_4_ = auVar38._12_4_ + 0.0;
      auVar47._8_4_ = 0x3f000000;
      auVar47._0_8_ = 0x3f0000003f000000;
      auVar47._12_4_ = 0x3f000000;
      auVar38 = vmulps_avx512vl(auVar65,auVar47);
      uVar9 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar26 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar74._0_4_ = auVar38._0_4_ + (float)uVar9;
      auVar74._4_4_ = auVar38._4_4_ + (float)uVar26;
      auVar74._8_4_ = auVar38._8_4_ + 0.0;
      auVar74._12_4_ = auVar38._12_4_ + 0.0;
      uVar15 = vmovlps_avx(auVar74);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar39._0_4_;
      uVar10 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar27 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar62 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar70._0_4_ = auVar38._0_4_ + (float)uVar10;
      auVar70._4_4_ = auVar38._4_4_ + (float)uVar27;
      auVar70._8_4_ = auVar38._8_4_ + 0.0;
      auVar70._12_4_ = auVar38._12_4_ + 0.0;
      uVar15 = vmovlps_avx(auVar70);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar64 + fVar62;
      auVar38 = vmovshdup_avx(auVar54);
      auVar71._0_4_ = 1.0 / local_24;
      auVar71._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar42 = vfmadd213ss_avx512f(auVar50,auVar38,ZEXT416((uint)(fVar61 * fVar53)));
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar53)),auVar40,auVar45);
      auVar40 = vblendps_avx(auVar38,auVar46,2);
      auVar38 = vaddss_avx512f(auVar42,auVar39);
      vxorps_avx512vl(auVar42,auVar42);
      auVar65 = ZEXT416((uint)fVar66);
      auVar42 = vfmadd231ss_fma(auVar38,auVar65,auVar54);
      vucomiss_avx512f(auVar42);
      auVar38 = vinsertps_avx(ZEXT416((uint)fVar60),auVar46,0x1c);
      auVar39 = vmovshdup_avx512vl(auVar37);
      auVar46 = vmulss_avx512f(auVar45,auVar35);
      auVar43 = vmulss_avx512f(auVar71,auVar39);
      auVar47 = vfmadd213ss_avx512f(auVar39,auVar40,ZEXT416((uint)(fVar2 * fVar53)));
      auVar39 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar53)),auVar44,ZEXT416((uint)fVar2));
      auVar47 = vaddss_avx512f(auVar47,auVar39);
      auVar39 = vmovshdup_avx(auVar63);
      auVar48 = vfmadd213ss_avx512f(auVar50,auVar39,auVar46);
      auVar35 = vfmsub231ss_avx512f(auVar46,auVar35,auVar45);
      auVar46 = vfmadd231ss_avx512f(auVar47,auVar54,auVar37);
      auVar35 = vaddss_avx512f(auVar48,auVar35);
      auVar35 = vfmadd231ss_avx512f(auVar35,auVar63,auVar65);
      auVar46 = vaddss_avx512f(auVar35,auVar46);
      auVar35 = vmovshdup_avx512vl(auVar41);
      auVar47 = vmulss_avx512f(auVar35,auVar44);
      auVar48 = vfmadd213ss_avx512f(auVar41,auVar40,auVar47);
      auVar35 = vfmsub213ss_avx512f(auVar35,auVar44,auVar47);
      auVar47 = vmovshdup_avx512vl(auVar38);
      auVar35 = vaddss_avx512f(auVar48,auVar35);
      auVar48 = vmovshdup_avx512vl(auVar40);
      auVar49 = vmulss_avx512f(auVar45,auVar48);
      auVar35 = vfmadd231ss_avx512f(auVar35,auVar54,auVar36);
      auVar45 = vfmsub213ss_avx512f(auVar48,auVar45,auVar49);
      auVar36 = vfmadd213ss_avx512f(auVar47,auVar50,auVar49);
      auVar45 = vaddss_avx512f(auVar36,auVar45);
      auVar45 = vfmadd231ss_fma(auVar45,auVar38,auVar65);
      auVar36 = vaddss_avx512f(auVar45,auVar35);
      auVar50 = vsubss_avx512f(ZEXT416((uint)local_30.super_Tuple3<pbrt::Vector3,_float>.x),
                               ZEXT416((uint)(auVar71._0_4_ * auVar37._0_4_)));
      auVar48._0_4_ = auVar71._0_4_ * auVar41._0_4_;
      auVar48._4_4_ = auVar71._0_4_ * auVar41._4_4_;
      auVar48._8_4_ = auVar71._0_4_ * auVar41._8_4_;
      auVar48._12_4_ = auVar71._0_4_ * auVar41._12_4_;
      auVar49._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar49._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar49._8_8_ = 0;
      auVar47 = vmovshdup_avx512vl(auVar49);
      auVar43 = vsubss_avx512f(auVar49,auVar43);
      auVar37 = vsubps_avx(auVar49,auVar48);
      auVar41 = vmulss_avx512f(auVar44,auVar47);
      auVar45 = vfmadd213ss_avx512f(auVar49,auVar40,auVar41);
      auVar41 = vfmsub231ss_avx512f(auVar41,auVar44,auVar47);
      auVar41 = vaddss_avx512f(auVar45,auVar41);
      auVar41 = vfmadd231ss_fma(auVar41,auVar54,
                                ZEXT416((uint)local_30.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar41 = vandps_avx512vl(auVar41,auVar35);
      auVar45 = vfmsub213ss_fma(auVar42,auVar71,auVar41);
      fVar61 = auVar45._0_4_;
      fVar60 = auVar71._0_4_ - (auVar71._0_4_ * auVar71._0_4_ * auVar42._0_4_) / auVar41._0_4_;
      auVar41 = vmulss_avx512f(auVar46,ZEXT416((uint)fVar60));
      fVar60 = auVar36._0_4_ * fVar60;
      auVar35 = vsubss_avx512f(auVar47,ZEXT416((uint)(auVar71._0_4_ * fVar2)));
      fVar66 = auVar41._0_4_;
      auVar41 = vaddss_avx512f(auVar50,ZEXT416((uint)(fVar66 * (float)(undefined4)uVar18 +
                                                     fVar61 * auVar63._0_4_)));
      auVar36 = vaddss_avx512f(auVar43,ZEXT416((uint)(auVar39._0_4_ * fVar61 +
                                                     auVar40._0_4_ * fVar66)));
      auVar41 = vinsertps_avx(auVar41,auVar36,0x10);
      uVar15 = vmovlps_avx(auVar41);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar15;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           auVar35._0_4_ + fVar66 * fVar53 + fVar61 * fVar1;
      fVar66 = (local_30.super_Tuple3<pbrt::Vector3,_float>.x - auVar71._0_4_ * fVar51) +
               auVar38._0_4_ * fVar61 + (float)(undefined4)uVar18 * fVar60;
      auVar41 = vinsertps_avx(ZEXT416((uint)fVar60),auVar45,0x10);
      auVar45 = vshufps_avx(auVar41,auVar41,0xe1);
      auVar35 = vpermi2ps_avx512vl(_DAT_02e28370,auVar38,auVar44);
      auVar36._0_4_ = auVar37._0_4_ + auVar40._0_4_ * auVar41._0_4_ + auVar35._0_4_ * auVar45._0_4_;
      auVar36._4_4_ = auVar37._4_4_ + auVar40._4_4_ * auVar41._4_4_ + auVar35._4_4_ * auVar45._4_4_;
      auVar36._8_4_ = auVar37._8_4_ + auVar40._8_4_ * auVar41._8_4_ + auVar35._8_4_ * auVar45._8_4_;
      auVar36._12_4_ =
           auVar37._12_4_ + auVar40._12_4_ * auVar41._12_4_ + auVar35._12_4_ * auVar45._12_4_;
    }
    else {
      if (flags != 0x11) goto LAB_004d8905;
      __return_storage_ptr__->hasDifferentials = true;
      pPVar33 = &(this->super_Interaction).pi;
      pPVar34 = &(this->super_Interaction).pi;
      auVar44._0_4_ =
           (pPVar33->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar44._4_4_ =
           (pPVar33->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
      ;
      auVar44._8_4_ =
           (pPVar34->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar44._12_4_ =
           (pPVar34->super_Point3<pbrt::Interval>).super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
      ;
      uVar15 = *(undefined8 *)
                &(this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar38 = vinsertps_avx(auVar44,ZEXT416((uint)(this->super_Interaction).pi.
                                                    super_Point3<pbrt::Interval>.
                                                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
                                                    high),0x10);
      fVar62 = ((this->super_Interaction).pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
               (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
               super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      auVar39 = vaddss_avx512f(ZEXT416((uint)fVar62),
                               ZEXT416((uint)(this->dpdx).super_Tuple3<pbrt::Vector3,_float>.z));
      auVar68._0_4_ = (float)uVar15 + auVar38._0_4_;
      auVar68._4_4_ = (float)((ulong)uVar15 >> 0x20) + auVar38._4_4_;
      auVar68._8_4_ = auVar38._8_4_ + 0.0;
      auVar68._12_4_ = auVar38._12_4_ + 0.0;
      auVar32._8_4_ = 0x3f000000;
      auVar32._0_8_ = 0x3f0000003f000000;
      auVar32._12_4_ = 0x3f000000;
      auVar38 = vmulps_avx512vl(auVar68,auVar32);
      uVar7 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar24 = (this->dpdx).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar73._0_4_ = auVar38._0_4_ + (float)uVar7;
      auVar73._4_4_ = auVar38._4_4_ + (float)uVar24;
      auVar73._8_4_ = auVar38._8_4_ + 0.0;
      auVar73._12_4_ = auVar38._12_4_ + 0.0;
      uVar15 = vmovlps_avx(auVar73);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z = auVar39._0_4_;
      auVar42 = vmovshdup_avx512vl(auVar63);
      uVar8 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar25 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar51 = (this->dpdy).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar69._0_4_ = auVar38._0_4_ + (float)uVar8;
      auVar69._4_4_ = auVar38._4_4_ + (float)uVar25;
      auVar69._8_4_ = auVar38._8_4_ + 0.0;
      auVar69._12_4_ = auVar38._12_4_ + 0.0;
      auVar38 = vmovshdup_avx(auVar37);
      uVar15 = vmovlps_avx(auVar69);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar15;
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z = fVar62 + fVar51;
      auVar39 = vmovshdup_avx(auVar54);
      auVar38 = vfmadd213ss_fma(auVar38,auVar39,ZEXT416((uint)(fVar2 * fVar53)));
      auVar44 = vfmsub231ss_fma(ZEXT416((uint)(fVar2 * fVar53)),auVar40,ZEXT416((uint)fVar2));
      auVar43 = vfmadd213ss_avx512f(auVar42,auVar50,ZEXT416((uint)(fVar61 * fVar1)));
      auVar42 = vfmsub231ss_fma(ZEXT416((uint)(fVar61 * fVar1)),auVar35,auVar45);
      auVar35 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ + auVar44._0_4_)),auVar54,auVar37);
      auVar38 = vaddss_avx512f(auVar43,auVar42);
      auVar47 = ZEXT416((uint)fVar66);
      auVar38 = vfmadd231ss_fma(auVar38,auVar63,auVar47);
      fVar66 = auVar38._0_4_ + auVar35._0_4_;
      auVar35 = vmovshdup_avx(auVar41);
      auVar38 = vmulss_avx512f(auVar40,auVar35);
      auVar44 = vfmadd213ss_avx512f(auVar41,auVar39,auVar38);
      auVar35 = vfmsub213ss_avx512f(auVar35,auVar40,auVar38);
      auVar38 = vmovshdup_avx512vl(auVar46);
      auVar42 = vmulss_avx512f(auVar38,auVar45);
      auVar43 = vfmadd213ss_avx512f(auVar50,auVar46,auVar42);
      auVar38 = vfmsub213ss_avx512f(auVar38,auVar45,auVar42);
      auVar35 = vaddss_avx512f(auVar44,auVar35);
      auVar35 = vfmadd231ss_fma(auVar35,auVar54,auVar36);
      auVar38 = vaddss_avx512f(auVar43,auVar38);
      auVar44 = vmulss_avx512f(auVar40,auVar45);
      auVar42 = vfmadd213ss_avx512f(auVar50,auVar39,auVar44);
      auVar45 = vfmsub231ss_avx512f(auVar44,auVar40,auVar45);
      auVar38 = vfmadd231ss_avx512f(auVar38,ZEXT416((uint)fVar60),auVar47);
      auVar45 = vaddss_avx512f(auVar42,auVar45);
      auVar38 = vaddss_avx512f(auVar38,auVar35);
      auVar35 = vfmadd231ss_fma(auVar45,auVar54,auVar47);
      fVar72 = auVar38._0_4_;
      auVar45 = vinsertps_avx(auVar39,auVar40,0x10);
      fVar64 = auVar35._0_4_;
      fVar1 = fVar1 * fVar64 + fVar66 * fVar53;
      auVar40 = vsubss_avx512f(ZEXT416((uint)local_30.super_Tuple3<pbrt::Vector3,_float>.x),auVar36)
      ;
      auVar75._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar75._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar51 = fVar60 * fVar64 + fVar72 * (float)(undefined4)uVar18;
      fVar53 = auVar63._0_4_ * fVar64 + fVar66 * (float)(undefined4)uVar18;
      fVar60 = auVar63._4_4_ * fVar64 + fVar66 * (float)uVar18._4_4_;
      fVar61 = auVar63._8_4_ * fVar64 + fVar66 * 0.0;
      fVar62 = auVar63._12_4_ * fVar64 + fVar66 * 0.0;
      auVar75._8_8_ = 0;
      auVar35 = vmovshdup_avx512vl(auVar75);
      fVar66 = fVar51 + fVar51 + auVar40._0_4_;
      auVar67._4_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar67._0_4_ = local_30.super_Tuple3<pbrt::Vector3,_float>.x;
      auVar67._8_8_ = 0;
      auVar40 = vsubps_avx(auVar67,auVar37);
      auVar55._0_4_ = fVar53 + fVar53 + auVar40._0_4_;
      auVar55._4_4_ = fVar60 + fVar60 + auVar40._4_4_;
      auVar55._8_4_ = fVar61 + fVar61 + auVar40._8_4_;
      auVar55._12_4_ = fVar62 + fVar62 + auVar40._12_4_;
      fVar51 = auVar46._0_4_ * fVar64 + auVar45._0_4_ * fVar72;
      fVar53 = auVar46._4_4_ * fVar64 + auVar45._4_4_ * fVar72;
      fVar60 = auVar46._8_4_ * fVar64 + auVar45._8_4_ * fVar72;
      fVar61 = auVar46._12_4_ * fVar64 + auVar45._12_4_ * fVar72;
      uVar15 = vmovlps_avx(auVar55);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x =
           (float)(int)uVar15;
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y =
           (float)(int)((ulong)uVar15 >> 0x20);
      auVar41 = vsubps_avx512vl(auVar75,auVar41);
      (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z =
           (auVar35._0_4_ - fVar2) + fVar1 + fVar1;
      auVar36._0_4_ = fVar51 + fVar51 + auVar41._0_4_;
      auVar36._4_4_ = fVar53 + fVar53 + auVar41._4_4_;
      auVar36._8_4_ = fVar60 + fVar60 + auVar41._8_4_;
      auVar36._12_4_ = fVar61 + fVar61 + auVar41._12_4_;
    }
    auVar41 = vunpcklps_avx(ZEXT416((uint)fVar66),auVar36);
    uVar15 = vmovlps_avx(auVar41);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar15;
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)uVar15 >> 0x20);
    fVar66 = (float)vextractps_avx(auVar36,1);
    (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z = fVar66;
  }
LAB_004d8905:
  fVar66 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar11 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar28 = (__return_storage_ptr__->rxDirection).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar56._0_4_ = (float)uVar11 * (float)uVar11;
  auVar56._4_4_ = (float)uVar28 * (float)uVar28;
  auVar56._8_8_ = 0;
  auVar41 = vmovshdup_avx(auVar56);
  if ((((1e+16 < fVar66 * fVar66 + auVar56._0_4_ + auVar41._0_4_) ||
       (fVar66 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.x,
       uVar12 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.y,
       uVar29 = (__return_storage_ptr__->ryDirection).super_Tuple3<pbrt::Vector3,_float>.z,
       auVar57._0_4_ = (float)uVar12 * (float)uVar12, auVar57._4_4_ = (float)uVar29 * (float)uVar29,
       auVar57._8_8_ = 0, auVar41 = vmovshdup_avx(auVar57),
       1e+16 < fVar66 * fVar66 + auVar57._0_4_ + auVar41._0_4_)) ||
      (fVar66 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x,
      uVar13 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y,
      uVar30 = (__return_storage_ptr__->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z,
      auVar58._0_4_ = (float)uVar13 * (float)uVar13, auVar58._4_4_ = (float)uVar30 * (float)uVar30,
      auVar58._8_8_ = 0, auVar41 = vmovshdup_avx(auVar58),
      1e+16 < fVar66 * fVar66 + auVar58._0_4_ + auVar41._0_4_)) ||
     (fVar66 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.x,
     uVar14 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.y,
     uVar31 = (__return_storage_ptr__->ryOrigin).super_Tuple3<pbrt::Point3,_float>.z,
     auVar59._0_4_ = (float)uVar14 * (float)uVar14, auVar59._4_4_ = (float)uVar31 * (float)uVar31,
     auVar59._8_8_ = 0, auVar41 = vmovshdup_avx(auVar59),
     1e+16 < fVar66 * fVar66 + auVar59._0_4_ + auVar41._0_4_)) {
    __return_storage_ptr__->hasDifferentials = false;
  }
  return __return_storage_ptr__;
}

Assistant:

RayDifferential SurfaceInteraction::SpawnRay(const RayDifferential &rayi,
                                             const BSDF &bsdf, Vector3f wi, int flags,
                                             Float eta) const {
    RayDifferential rd(SpawnRay(wi));
    if (rayi.hasDifferentials) {
        // Compute ray differentials for specular reflection or transmission
        // Compute common factors for specular ray differentials
        Normal3f ns = shading.n;
        Normal3f dndx = shading.dndu * dudx + shading.dndv * dvdx;
        Normal3f dndy = shading.dndu * dudy + shading.dndv * dvdy;
        Vector3f dwodx = -rayi.rxDirection - wo, dwody = -rayi.ryDirection - wo;

        if (flags == BxDFFlags::SpecularReflection) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential reflected directions
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2 * Vector3f(Dot(wo, ns) * dndx + dwoDotNdx * ns);
            rd.ryDirection =
                wi - dwody + 2 * Vector3f(Dot(wo, ns) * dndy + dwoDotNdy * ns);

        } else if (flags == BxDFFlags::SpecularTransmission) {
            // Initialize origins of specular differential rays
            rd.hasDifferentials = true;
            rd.rxOrigin = p() + dpdx;
            rd.ryOrigin = p() + dpdy;

            // Compute differential transmitted directions
            // Find _eta_ and oriented surface normal for transmission
            eta = 1 / eta;
            if (Dot(wo, ns) < 0) {
                ns = -ns;
                dndx = -dndx;
                dndy = -dndy;
            }

            // Compute partial derivatives of $\mu$
            Float dwoDotNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dwoDotNdy = Dot(dwody, ns) + Dot(wo, dndy);
            Float mu = eta * Dot(wo, ns) - AbsDot(wi, ns);
            Float dmudx = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdx;
            Float dmudy = (eta - (eta * eta * Dot(wo, ns)) / AbsDot(wi, ns)) * dwoDotNdy;

            rd.rxDirection = wi - eta * dwodx + Vector3f(mu * dndx + dmudx * ns);
            rd.ryDirection = wi - eta * dwody + Vector3f(mu * dndy + dmudy * ns);
        }
    }
    // Squash potentially troublesome differentials
    if (LengthSquared(rd.rxDirection) > 1e16f || LengthSquared(rd.ryDirection) > 1e16f ||
        LengthSquared(Vector3f(rd.rxOrigin)) > 1e16f ||
        LengthSquared(Vector3f(rd.ryOrigin)) > 1e16f)
        rd.hasDifferentials = false;

    return rd;
}